

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  PositionType *pPVar3;
  cmNinjaVars *this_00;
  cmGeneratorTarget *this_01;
  pointer pcVar4;
  size_t sVar5;
  cmLocalNinjaGenerator *pcVar6;
  cmLocalNinjaGenerator *this_02;
  cmMakefile *this_03;
  size_type sVar7;
  pointer pbVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  _func_int **pp_Var12;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar13;
  int iVar14;
  TargetType TVar15;
  int iVar16;
  cmGlobalNinjaGenerator *pcVar17;
  string *psVar18;
  char *pcVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  char *__s;
  size_t sVar22;
  mapped_type *pmVar23;
  cmGeneratedFileStream *os;
  size_type sVar24;
  cmOutputConverter *pcVar25;
  bool bVar26;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  bool usedResponseFile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  undefined8 local_410;
  char *local_408;
  cmGeneratorTarget *local_400;
  cmGlobalNinjaGenerator *local_3f8;
  undefined1 local_3f0 [48];
  cmOutputConverter *local_3c0;
  Names tgtNames;
  string objPath;
  string local_2d8;
  string targetOutputImplib;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string local_250;
  string langFlags;
  string linkPath;
  string frameworkPath;
  string local_1d0;
  string local_1b0;
  string local_190;
  string createRule;
  cmNinjaBuild build;
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_3c0 = (cmOutputConverter *)output;
  local_3f8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  local_400 = this_01;
  cmGeneratorTarget::GetFullPath(&build.Comment,this_01,config,ImportLibraryArtifact,false);
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar18 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar17,&build.Comment);
  targetOutputImplib._M_dataplus._M_p = (pointer)&targetOutputImplib.field_2;
  pcVar4 = (psVar18->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetOutputImplib,pcVar4,pcVar4 + psVar18->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)build.Comment._M_dataplus._M_p != &build.Comment.field_2) {
    operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1);
  }
  sVar5 = config->_M_string_length;
  if (sVar5 == fileConfig->_M_string_length) {
    if (sVar5 != 0) {
      iVar14 = bcmp((config->_M_dataplus)._M_p,(fileConfig->_M_dataplus)._M_p,sVar5);
      if (iVar14 != 0) goto LAB_0041f868;
    }
  }
  else {
LAB_0041f868:
    pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (&linkLineComputer,pcVar6,local_400);
    pcVar13 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              DirectoryState.Tree;
    pp_Var12 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
               _vptr_cmLinkLineComputer;
    (*(local_3f8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x49])(&usedResponseFile,local_3f8,fileConfig);
    build.Comment._M_dataplus._M_p = (pointer)pcVar13;
    build.Comment._M_string_length = (size_type)pp_Var12;
    build.Comment.field_2._M_allocated_capacity = (size_type)paStack_438;
    build.Comment.field_2._8_8_ = _usedResponseFile;
    build.Rule._M_dataplus._M_p = &DAT_00000001;
    build.Rule._M_string_length =
         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
    views._M_len = 3;
    views._M_array = (iterator)&build;
    cmCatViews_abi_cxx11_(&tgtNames.Base,views);
    paVar1 = &build.Comment.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_430) {
      operator_delete(_usedResponseFile,(ulong)(local_430._M_allocated_capacity + 1));
    }
    if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer !=
        (_func_int **)
        &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
         DirectoryState.Position) {
      operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      _vptr_cmLinkLineComputer,
                      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position + 1);
    }
    (*(local_3f8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x16])(&build,local_3f8,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)&tgtNames,(string *)&build);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)build.Comment._M_dataplus._M_p != paVar1) {
      operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1
                     );
    }
    sVar5 = outputDir->_M_string_length;
    if (sVar5 == tgtNames.Base._M_string_length) {
      if (sVar5 != 0) {
        iVar14 = bcmp((outputDir->_M_dataplus)._M_p,tgtNames.Base._M_dataplus._M_p,sVar5);
        if (iVar14 != 0) goto LAB_0041f9af;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
        operator_delete(tgtNames.Base._M_dataplus._M_p,
                        tgtNames.Base.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00420c43;
    }
LAB_0041f9af:
    cmGeneratorTarget::GetFullName(&build.Comment,local_400,config,ImportLibraryArtifact);
    sVar7 = build.Comment._M_string_length;
    bVar26 = true;
    if (build.Comment._M_string_length == 0) {
LAB_0041fa65:
      bVar9 = false;
    }
    else {
      cmGeneratorTarget::GetFullName(&local_190,local_400,fileConfig,ImportLibraryArtifact);
      if (local_190._M_string_length == 0) goto LAB_0041fa65;
      cmGeneratorTarget::GetFullPath(&local_1b0,local_400,fileConfig,ImportLibraryArtifact,false);
      pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar18 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar17,&local_1b0);
      bVar9 = true;
      if (targetOutputImplib._M_string_length == psVar18->_M_string_length) {
        if (targetOutputImplib._M_string_length == 0) {
          bVar26 = false;
        }
        else {
          iVar14 = bcmp(targetOutputImplib._M_dataplus._M_p,(psVar18->_M_dataplus)._M_p,
                        targetOutputImplib._M_string_length);
          bVar26 = iVar14 != 0;
        }
      }
      else {
        bVar26 = true;
      }
    }
    if ((bVar9) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2)) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((sVar7 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2)) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)build.Comment._M_dataplus._M_p != paVar1) {
      operator_delete(build.Comment._M_dataplus._M_p,build.Comment.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
      operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1
                     );
    }
    if (!bVar26) goto LAB_00420c43;
  }
  LanguageLinkerDeviceRule(&local_1d0,this,config);
  build.Rule._M_dataplus._M_p = (pointer)&build.Rule.field_2;
  build.Comment._M_string_length = 0;
  build.Comment.field_2._M_allocated_capacity =
       build.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
    build.Rule.field_2._8_8_ = local_1d0.field_2._8_8_;
  }
  else {
    build.Rule._M_dataplus._M_p = local_1d0._M_dataplus._M_p;
  }
  build.Rule._M_string_length = local_1d0._M_string_length;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  p_Var2 = &build.Variables._M_t._M_impl.super__Rb_tree_header;
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  build.Comment._M_dataplus._M_p = (pointer)&build.Comment.field_2;
  memset(&build.Outputs,0,0x90);
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  build.RspFile._M_dataplus._M_p = (pointer)&build.RspFile.field_2;
  build.RspFile._M_string_length = 0;
  build.RspFile.field_2._M_local_buf[0] = '\0';
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  build.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pcVar19 = GetVisibleTypeName(this);
  tgtNames.Base.field_2._M_allocated_capacity = strlen(pcVar19);
  pcVar25 = local_3c0;
  tgtNames.Base._M_dataplus._M_p = (pointer)0x9;
  tgtNames.Base._M_string_length = (size_type)anon_var_dwarf_1890fe7;
  pPVar3 = &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
            DirectoryState.Position;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)&DAT_00000001;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = CONCAT71(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                      StateDir.DirectoryState.Position._1_7_,0x20);
  tgtNames.Output._M_dataplus._M_p = &DAT_00000001;
  tgtNames.Output.field_2._8_8_ = (local_3c0->StateSnapshot).State;
  tgtNames.Output.field_2._M_allocated_capacity =
       (size_type)(local_3c0->StateSnapshot).Position.Tree;
  views_00._M_len = 4;
  views_00._M_array = (iterator)&tgtNames;
  tgtNames.Base.field_2._8_8_ = pcVar19;
  tgtNames.Output._M_string_length = (size_type)pPVar3;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)pPVar3;
  cmCatViews_abi_cxx11_((string *)&usedResponseFile,views_00);
  std::__cxx11::string::operator=((string *)&build,(string *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,(ulong)(local_430._M_allocated_capacity + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&build.Outputs,(value_type *)pcVar25);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,config);
  tgtNames.Base.field_2._M_allocated_capacity =
       (size_type)
       build.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tgtNames.Base._M_string_length =
       (size_type)
       build.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  tgtNames.Base._M_dataplus._M_p =
       (pointer)build.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  build.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                _vptr_cmLinkLineComputer;
  build.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                DirectoryState.Tree;
  build.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                DirectoryState.Position;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,&tgtNames.Base,
             config,false);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = (PositionType)
             build.ImplicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
         build.ImplicitDeps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)
         build.ImplicitDeps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  build.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_usedResponseFile;
  build.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paStack_438;
  build.ImplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_430._M_allocated_capacity;
  _usedResponseFile = (pointer)0x0;
  paStack_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_430._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetLinkerLanguage
            (&tgtNames.Base,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,local_400,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar25 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  source._M_str = (char *)(local_3c0->StateSnapshot).State;
  source._M_len = (size_t)(local_3c0->StateSnapshot).Position.Tree;
  local_3c0 = pcVar25;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&tgtNames.Base,pcVar25,source,SHELL);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)pPVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"TARGET_FILE","");
  this_00 = &build.Variables;
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&linkLineComputer);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&tgtNames);
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar3) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  this_02 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar25 = &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_02 == (cmLocalNinjaGenerator *)0x0) {
    pcVar25 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)this_02);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&tgtNames,(cmStateSnapshot *)&usedResponseFile);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,pcVar25,(cmStateDirectory *)&tgtNames,local_3f8);
  iVar14 = (*(local_3f8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x26])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar14,0));
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LINK_LIBRARIES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&tgtNames.Base);
  _usedResponseFile = (pointer)&local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar6,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             pmVar20,pmVar21,&frameworkPath,&linkPath,local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&tgtNames.Base,local_400,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  _usedResponseFile = (pointer)&local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  cmGlobalNinjaGenerator::EncodeLiteral(&tgtNames.Base,local_3f8,pmVar20);
  local_3f0._0_8_ = local_3f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"LINK_FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)local_3f0);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&tgtNames);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3f0._0_8_ !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3f0 + 0x10)) {
    operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  cmCommonTargetGenerator::GetManifests(&tgtNames.Base,(cmCommonTargetGenerator *)this,config);
  _usedResponseFile = (pointer)&local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"MANIFESTS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&tgtNames.Base,&frameworkPath,&linkPath);
  _usedResponseFile = (pointer)&local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&tgtNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"CUDA","");
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar6,&langFlags,local_400,&tgtNames.Base,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tgtNames,"LANGUAGE_COMPILE_FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&tgtNames.Base);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  TargetNames(&tgtNames,this,config);
  bVar26 = cmGeneratorTarget::HasSOName(local_400,config);
  if (bVar26) {
    this_03 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&usedResponseFile,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    __s = cmMakefile::GetSONameFlag(this_03,(string *)&usedResponseFile);
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"SONAME_FLAG","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,(key_type *)local_3f0);
    pcVar19 = (char *)pmVar20->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar20,0,pcVar19,(ulong)__s);
    if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_430) {
      operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
    }
    source_00._M_str = tgtNames.SharedObject._M_dataplus._M_p;
    source_00._M_len = tgtNames.SharedObject._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,local_3c0,source_00,SHELL);
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"SONAME","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,(key_type *)local_3f0);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&usedResponseFile);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3f0._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3f0 + 0x10)) {
      operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_430) {
      operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
    }
    TVar15 = cmGeneratorTarget::GetType(local_400);
    if (TVar15 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&usedResponseFile,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      if (paStack_438 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        source_01._M_str = _usedResponseFile;
        source_01._M_len = (size_t)paStack_438;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_3f0,local_3c0,source_01,SHELL);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"INSTALLNAME_DIR","");
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,&objPath);
        std::__cxx11::string::operator=((string *)pmVar20,(string *)local_3f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3f0._0_8_ !=
            (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_430) {
        operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
      }
    }
  }
  if (tgtNames.ImportLibrary._M_string_length != 0) {
    source_02._M_str = targetOutputImplib._M_dataplus._M_p;
    source_02._M_len = targetOutputImplib._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,local_3c0,source_02,SHELL);
    local_3f0._0_8_ = local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"TARGET_IMPLIB","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,(key_type *)local_3f0);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3f0._0_8_ !=
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3f0 + 0x10)) {
      operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&targetOutputImplib);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_usedResponseFile != &local_430) {
      operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_3f0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  uVar11 = local_3f0._8_8_;
  uVar10 = local_3f0._0_8_;
  (*(local_3f8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
  )(&local_2d8,local_3f8,config);
  _usedResponseFile = (pointer)uVar11;
  paStack_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar10;
  local_430._M_allocated_capacity = local_2d8._M_string_length;
  local_430._8_8_ = local_2d8._M_dataplus._M_p;
  views_01._M_len = 2;
  views_01._M_array = (iterator)&usedResponseFile;
  cmCatViews_abi_cxx11_(&objPath,views_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3f0._0_8_ !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_3f0 + 0x10)) {
    operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
  }
  pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar18 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar17,&objPath);
  source_03._M_str = (psVar18->_M_dataplus)._M_p;
  source_03._M_len = psVar18->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&usedResponseFile,
             &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_03,SHELL);
  local_3f0._0_8_ = local_3f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"OBJECT_DIR","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)local_3f0);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&usedResponseFile);
  if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,this_00,config);
  _usedResponseFile = (pointer)&local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_LIBRARIES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  _usedResponseFile = (pointer)&local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_usedResponseFile != &local_430) {
    operator_delete(_usedResponseFile,local_430._M_allocated_capacity + 1);
  }
  if (local_3f8->UsingGCCOnWindows == true) {
    sVar7 = pmVar20->_M_string_length;
    if (sVar7 != 0) {
      pcVar4 = (pmVar20->_M_dataplus)._M_p;
      sVar24 = 0;
      do {
        if (pcVar4[sVar24] == '\\') {
          pcVar4[sVar24] = '/';
        }
        sVar24 = sVar24 + 1;
      } while (sVar7 != sVar24);
    }
    sVar7 = pmVar21->_M_string_length;
    if (sVar7 != 0) {
      pcVar4 = (pmVar21->_M_dataplus)._M_p;
      sVar24 = 0;
      do {
        if (pcVar4[sVar24] == '\\') {
          pcVar4[sVar24] = '/';
        }
        sVar24 = sVar24 + 1;
      } while (sVar7 != sVar24);
    }
  }
  sVar22 = cmSystemTools::CalculateCommandLineLengthLimit();
  pmVar23 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&local_3f8->RuleCmdLength,&build.Rule);
  iVar14 = *pmVar23;
  psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(local_400);
  pcVar4 = (psVar18->_M_dataplus)._M_p;
  pbVar8 = (pointer)psVar18->_M_string_length;
  iVar16 = (*(local_3f8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar16 == '\0') {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  }
  else {
    local_3f0._0_8_ = &DAT_00000001;
    paStack_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3f0 + 0x10);
    local_3f0[0x10] = '.';
    local_430._8_8_ = (config->_M_dataplus)._M_p;
    local_430._M_allocated_capacity = config->_M_string_length;
    _usedResponseFile = &DAT_00000001;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&usedResponseFile;
    local_3f0._8_8_ = paStack_438;
    cmCatViews_abi_cxx11_(&local_250,views_02);
  }
  _usedResponseFile = (pointer)0xb;
  paStack_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x79d880;
  local_420 = local_250._M_string_length;
  local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p;
  local_410 = 4;
  local_408 = ".rsp";
  views_03._M_len = 4;
  views_03._M_array = (iterator)&usedResponseFile;
  local_430._M_allocated_capacity = (size_type)pbVar8;
  local_430._8_8_ = pcVar4;
  cmCatViews_abi_cxx11_(&local_2d8,views_03);
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar17,&local_2d8);
  std::__cxx11::string::_M_assign((string *)&build.RspFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &build.OrderOnlyDeps,config,config,DependOnTargetArtifact);
  _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (local_3f8,(ostream *)os,&build,(int)sVar22 - iVar14,&usedResponseFile);
  WriteNvidiaDeviceLinkRule(this,usedResponseFile,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.SharedObject._M_dataplus._M_p != &tgtNames.SharedObject.field_2) {
    operator_delete(tgtNames.SharedObject._M_dataplus._M_p,
                    tgtNames.SharedObject.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.PDB._M_dataplus._M_p != &tgtNames.PDB.field_2) {
    operator_delete(tgtNames.PDB._M_dataplus._M_p,tgtNames.PDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.ImportLibrary._M_dataplus._M_p != &tgtNames.ImportLibrary.field_2) {
    operator_delete(tgtNames.ImportLibrary._M_dataplus._M_p,
                    tgtNames.ImportLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Real._M_dataplus._M_p != &tgtNames.Real.field_2) {
    operator_delete(tgtNames.Real._M_dataplus._M_p,tgtNames.Real.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Output._M_dataplus._M_p != &tgtNames.Output.field_2) {
    operator_delete(tgtNames.Output._M_dataplus._M_p,
                    tgtNames.Output.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tgtNames.Base._M_dataplus._M_p != &tgtNames.Base.field_2) {
    operator_delete(tgtNames.Base._M_dataplus._M_p,tgtNames.Base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaBuild::~cmNinjaBuild(&build);
LAB_00420c43:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] = globalGen->EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}